

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeFrameRestore(VdbeFrame *pFrame)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Vdbe *pVVar3;
  Mem *pMVar4;
  
  pVVar3 = pFrame->v;
  pVVar3->aOnceFlag = pFrame->aOnceFlag;
  pVVar3->nOnceFlag = pFrame->nOnceFlag;
  pMVar4 = pFrame->aMem;
  pVVar3->aOp = pFrame->aOp;
  pVVar3->aMem = pMVar4;
  uVar1 = pFrame->nOp;
  uVar2 = pFrame->nMem;
  pVVar3->nMem = uVar2;
  pVVar3->nOp = uVar1;
  pVVar3->apCsr = pFrame->apCsr;
  pVVar3->nCursor = pFrame->nCursor;
  pVVar3->db->lastRowid = pFrame->lastRowid;
  pVVar3->nChange = pFrame->nChange;
  return pFrame->pc;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeFrameRestore(VdbeFrame *pFrame){
  Vdbe *v = pFrame->v;
  v->aOnceFlag = pFrame->aOnceFlag;
  v->nOnceFlag = pFrame->nOnceFlag;
  v->aOp = pFrame->aOp;
  v->nOp = pFrame->nOp;
  v->aMem = pFrame->aMem;
  v->nMem = pFrame->nMem;
  v->apCsr = pFrame->apCsr;
  v->nCursor = pFrame->nCursor;
  v->db->lastRowid = pFrame->lastRowid;
  v->nChange = pFrame->nChange;
  return pFrame->pc;
}